

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

int WebRtcIsac_DecodeLb(TransformTables *transform_tables,float *signal_out,
                       ISACLBDecStruct *ISACdecLB_obj,int16_t *current_framesamples,
                       int16_t isRCUPayload)

{
  short sVar1;
  int16_t AvgPitchGain_Q12_00;
  int iVar2;
  float fVar3;
  int16_t aiVar4 [4];
  int local_3164;
  int frame_mode;
  int frame_nb;
  float gain;
  short local_3154;
  int16_t AvgPitchGain_Q12;
  int16_t PitchGains_Q12 [4];
  double AvgPitchGain;
  double PitchGains [4];
  double PitchLags [4];
  double imag_f [240];
  double real_f [240];
  double hi_filt_coef [42];
  double lo_filt_coef [78];
  double LPw_pf [240];
  double HPw [240];
  double LPw [240];
  float HP_dec_float [240];
  float LP_dec_float [240];
  int iStack_3c;
  int16_t bandwidthInd;
  int err;
  int len;
  int k;
  int16_t isRCUPayload_local;
  int16_t *current_framesamples_local;
  ISACLBDecStruct *ISACdecLB_obj_local;
  float *signal_out_local;
  TransformTables *transform_tables_local;
  
  WebRtcIsac_ResetBitstream(&ISACdecLB_obj->bitstr_obj);
  iStack_3c = 0;
  transform_tables_local._4_4_ =
       WebRtcIsac_DecodeFrameLen(&ISACdecLB_obj->bitstr_obj,current_framesamples);
  if (-1 < transform_tables_local._4_4_) {
    sVar1 = *current_framesamples;
    transform_tables_local._4_4_ =
         WebRtcIsac_DecodeSendBW(&ISACdecLB_obj->bitstr_obj,(int16_t *)((long)LP_dec_float + 0x3be))
    ;
    if (-1 < transform_tables_local._4_4_) {
      for (local_3164 = 0; local_3164 <= (int)sVar1 / 0x3c0; local_3164 = local_3164 + 1) {
        iVar2 = WebRtcIsac_DecodePitchGain(&ISACdecLB_obj->bitstr_obj,(int16_t *)&gain);
        if (iVar2 < 0) {
          return iVar2;
        }
        iVar2 = WebRtcIsac_DecodePitchLag
                          (&ISACdecLB_obj->bitstr_obj,(int16_t *)&gain,PitchGains + 3);
        if (iVar2 < 0) {
          return iVar2;
        }
        AvgPitchGain_Q12_00 =
             (int16_t)((int)gain._0_2_ + (int)gain._2_2_ + (int)local_3154 + (int)AvgPitchGain_Q12
                      >> 2);
        iVar2 = WebRtcIsac_DecodeLpc(&ISACdecLB_obj->bitstr_obj,hi_filt_coef + 0x29,real_f + 0xef);
        if (iVar2 < 0) {
          return iVar2;
        }
        iStack_3c = WebRtcIsac_DecodeSpec
                              (&ISACdecLB_obj->bitstr_obj,AvgPitchGain_Q12_00,kIsacLowerBand,
                               imag_f + 0xef,PitchLags + 3);
        if (iStack_3c < 0) {
          return iStack_3c;
        }
        WebRtcIsac_Spec2time
                  (transform_tables,imag_f + 0xef,PitchLags + 3,HPw + 0xef,LPw_pf + 0xef,
                   &ISACdecLB_obj->fftstr_obj);
        for (err = 0; err < 4; err = err + 1) {
          PitchGains[(long)err + -1] =
               (double)((float)(int)*(short *)((long)&gain + (long)err * 2) / 4096.0);
        }
        if (isRCUPayload != 0) {
          for (err = 0; err < 0xf0; err = err + 1) {
            HPw[(long)err + 0xef] = HPw[(long)err + 0xef] * 2.5;
            LPw_pf[(long)err + 0xef] = LPw_pf[(long)err + 0xef] * 2.5;
          }
        }
        WebRtcIsac_PitchfilterPost
                  (HPw + 0xef,lo_filt_coef + 0x4d,&ISACdecLB_obj->pitchfiltstr_obj,PitchGains + 3,
                   &AvgPitchGain);
        fVar3 = (float)(int)AvgPitchGain_Q12_00 / 4096.0;
        aiVar4 = (int16_t  [4])(double)fVar3;
        PitchGains_Q12[0] = aiVar4[0];
        PitchGains_Q12[1] = aiVar4[1];
        PitchGains_Q12[2] = aiVar4[2];
        PitchGains_Q12[3] = aiVar4[3];
        for (err = 0; err < 0xf0; err = err + 1) {
          lo_filt_coef[(long)err + 0x4d] =
               (double)(fVar3 * -0.45 + 1.0) * lo_filt_coef[(long)err + 0x4d];
        }
        if (isRCUPayload != 0) {
          for (err = 0; err < 0xf0; err = err + 1) {
            lo_filt_coef[(long)err + 0x4d] = lo_filt_coef[(long)err + 0x4d] * 0.4000000059604645;
            LPw_pf[(long)err + 0xef] = LPw_pf[(long)err + 0xef] * 0.4000000059604645;
          }
        }
        WebRtcIsac_NormLatticeFilterAr
                  (0xc,(ISACdecLB_obj->maskfiltstr_obj).PostStateLoF,
                   (ISACdecLB_obj->maskfiltstr_obj).PostStateLoG,lo_filt_coef + 0x4d,
                   hi_filt_coef + 0x29,HP_dec_float + 0xee);
        WebRtcIsac_NormLatticeFilterAr
                  (6,(ISACdecLB_obj->maskfiltstr_obj).PostStateHiF,
                   (ISACdecLB_obj->maskfiltstr_obj).PostStateHiG,LPw_pf + 0xef,real_f + 0xef,
                   (float *)(LPw + 0xef));
        WebRtcIsac_FilterAndCombineFloat
                  (HP_dec_float + 0xee,(float *)(LPw + 0xef),signal_out + local_3164 * 0x1e0,
                   &ISACdecLB_obj->postfiltbankstr_obj);
      }
      transform_tables_local._4_4_ = iStack_3c;
    }
  }
  return transform_tables_local._4_4_;
}

Assistant:

int WebRtcIsac_DecodeLb(const TransformTables* transform_tables,
                        float* signal_out, ISACLBDecStruct* ISACdecLB_obj,
                        int16_t* current_framesamples,
                        int16_t isRCUPayload) {
  int k;
  int len, err;
  int16_t bandwidthInd;

  float LP_dec_float[FRAMESAMPLES_HALF];
  float HP_dec_float[FRAMESAMPLES_HALF];

  double LPw[FRAMESAMPLES_HALF];
  double HPw[FRAMESAMPLES_HALF];
  double LPw_pf[FRAMESAMPLES_HALF];

  double lo_filt_coef[(ORDERLO + 1)*SUBFRAMES];
  double hi_filt_coef[(ORDERHI + 1)*SUBFRAMES];

  double real_f[FRAMESAMPLES_HALF];
  double imag_f[FRAMESAMPLES_HALF];

  double PitchLags[4];
  double PitchGains[4];
  double AvgPitchGain;
  int16_t PitchGains_Q12[4];
  int16_t AvgPitchGain_Q12;

  float gain;

  int frame_nb; /* counter */
  int frame_mode; /* 0 30ms, 1 for 60ms */
  /* Processed_samples: 480 (30, 60 ms). Cannot take other values. */

  WebRtcIsac_ResetBitstream(&(ISACdecLB_obj->bitstr_obj));

  len = 0;

  /* Decode framelength and BW estimation - not used,
     only for stream pointer*/
  err = WebRtcIsac_DecodeFrameLen(&ISACdecLB_obj->bitstr_obj,
                                  current_framesamples);
  if (err < 0) {
    return err;
  }

  /* Frame_mode:
   * 0: indicates 30 ms frame (480 samples)
   * 1: indicates 60 ms frame (960 samples) */
  frame_mode = *current_framesamples / MAX_FRAMESAMPLES;

  err = WebRtcIsac_DecodeSendBW(&ISACdecLB_obj->bitstr_obj, &bandwidthInd);
  if (err < 0) {
    return err;
  }

  /* One loop if it's one frame (20 or 30ms), 2 loops if 2 frames
     bundled together (60ms). */
  for (frame_nb = 0; frame_nb <= frame_mode; frame_nb++) {
    /* Decode & de-quantize pitch parameters */
    err = WebRtcIsac_DecodePitchGain(&ISACdecLB_obj->bitstr_obj,
                                     PitchGains_Q12);
    if (err < 0) {
      return err;
    }

    err = WebRtcIsac_DecodePitchLag(&ISACdecLB_obj->bitstr_obj, PitchGains_Q12,
                                    PitchLags);
    if (err < 0) {
      return err;
    }

    AvgPitchGain_Q12 = (PitchGains_Q12[0] + PitchGains_Q12[1] +
        PitchGains_Q12[2] + PitchGains_Q12[3]) >> 2;

    /* Decode & de-quantize filter coefficients. */
    err = WebRtcIsac_DecodeLpc(&ISACdecLB_obj->bitstr_obj, lo_filt_coef,
                               hi_filt_coef);
    if (err < 0) {
      return err;
    }
    /* Decode & de-quantize spectrum. */
    len = WebRtcIsac_DecodeSpec(&ISACdecLB_obj->bitstr_obj, AvgPitchGain_Q12,
                                kIsacLowerBand, real_f, imag_f);
    if (len < 0) {
      return len;
    }

    /* Inverse transform. */
    WebRtcIsac_Spec2time(transform_tables, real_f, imag_f, LPw, HPw,
                         &ISACdecLB_obj->fftstr_obj);

    /* Convert PitchGains back to float for pitchfilter_post */
    for (k = 0; k < 4; k++) {
      PitchGains[k] = ((float)PitchGains_Q12[k]) / 4096;
    }
    if (isRCUPayload) {
      for (k = 0; k < 240; k++) {
        LPw[k] *= RCU_TRANSCODING_SCALE_INVERSE;
        HPw[k] *= RCU_TRANSCODING_SCALE_INVERSE;
      }
    }

    /* Inverse pitch filter. */
    WebRtcIsac_PitchfilterPost(LPw, LPw_pf, &ISACdecLB_obj->pitchfiltstr_obj,
                               PitchLags, PitchGains);
    /* Convert AvgPitchGain back to float for computation of gain. */
    AvgPitchGain = ((float)AvgPitchGain_Q12) / 4096;
    gain = 1.0f - 0.45f * (float)AvgPitchGain;

    for (k = 0; k < FRAMESAMPLES_HALF; k++) {
      /* Reduce gain to compensate for pitch enhancer. */
      LPw_pf[k] *= gain;
    }

    if (isRCUPayload) {
      for (k = 0; k < FRAMESAMPLES_HALF; k++) {
        /* Compensation for transcoding gain changes. */
        LPw_pf[k] *= RCU_TRANSCODING_SCALE;
        HPw[k] *= RCU_TRANSCODING_SCALE;
      }
    }
    /* Perceptual post-filtering (using normalized lattice filter). */
    WebRtcIsac_NormLatticeFilterAr(
        ORDERLO, ISACdecLB_obj->maskfiltstr_obj.PostStateLoF,
        (ISACdecLB_obj->maskfiltstr_obj).PostStateLoG, LPw_pf, lo_filt_coef,
        LP_dec_float);
    WebRtcIsac_NormLatticeFilterAr(
        ORDERHI, ISACdecLB_obj->maskfiltstr_obj.PostStateHiF,
        (ISACdecLB_obj->maskfiltstr_obj).PostStateHiG, HPw, hi_filt_coef,
        HP_dec_float);

    /* Recombine the 2 bands. */
    WebRtcIsac_FilterAndCombineFloat(LP_dec_float, HP_dec_float,
                                     signal_out + frame_nb * FRAMESAMPLES,
                                     &ISACdecLB_obj->postfiltbankstr_obj);
  }
  return len;
}